

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void post_decrement_suite::test_array(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>> *pbVar2;
  reference pbVar3;
  pointer ptVar4;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_610;
  basic_variable<std::allocator<char>_> local_608;
  iterator local_5d0;
  basic_variable<std::allocator<char>_> local_5b8;
  iterator local_580;
  basic_variable<std::allocator<char>_> local_568;
  iterator local_530;
  basic_variable<std::allocator<char>_> local_518;
  iterator local_4e0;
  basic_variable<std::allocator<char>_> local_4c8;
  iterator local_490;
  basic_variable<std::allocator<char>_> local_478;
  iterator local_440;
  basic_variable<std::allocator<char>_> local_428;
  iterator local_3f0;
  basic_variable<std::allocator<char>_> local_3d8;
  iterator local_3a0;
  basic_variable<std::allocator<char>_> local_388;
  iterator local_350;
  basic_variable<std::allocator<char>_> local_338;
  iterator local_300;
  basic_variable<std::allocator<char>_> local_2e8;
  iterator local_2b0;
  basic_variable<std::allocator<char>_> local_298;
  iterator local_260;
  basic_variable<std::allocator<char>_> local_248;
  iterator local_210;
  undefined1 local_1f8 [8];
  iterator result;
  undefined1 local_1c8 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_610 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_610 = local_610 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_610);
  } while (local_610 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)local_1c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_1c8,
                     (iterator *)
                     &result.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x690,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator *)local_1f8,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_210,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_210);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x692,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u32string>
                    (pbVar2);
  boost::detail::test_impl
            ("where->same<variable::u32string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x693,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_248,L"delta");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_248);
  boost::detail::test_impl
            ("*where == variable(U\"delta\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x694,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--(&local_260,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_1f8,&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_298,L"delta");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_298);
  boost::detail::test_impl
            ("*result == variable(U\"delta\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x696,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_2b0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x697,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b0);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u16string>
                    (pbVar2);
  boost::detail::test_impl
            ("where->same<variable::u16string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x698,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"charlie");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_2e8);
  boost::detail::test_impl
            ("*where == variable(u\"charlie\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x699,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--(&local_300,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_1f8,&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_338,L"charlie");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_338);
  boost::detail::test_impl
            ("*result == variable(u\"charlie\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x69b,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_350,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_350);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x69c,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::wstring>(pbVar2);
  boost::detail::test_impl
            ("where->same<variable::wstring_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x69d,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_388,L"bravo");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_388);
  boost::detail::test_impl
            ("*where == variable(L\"bravo\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x69e,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--(&local_3a0,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_1f8,&local_3a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a0);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3d8,L"bravo");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_3d8);
  boost::detail::test_impl
            ("*result == variable(L\"bravo\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a0,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_3f0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a1,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f0);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>(pbVar2);
  boost::detail::test_impl
            ("where->same<variable::string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a2,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_428,"alpha");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_428);
  boost::detail::test_impl
            ("*where == variable(\"alpha\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a3,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--(&local_440,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_1f8,&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_440);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_478,"alpha");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_478);
  boost::detail::test_impl
            ("*result == variable(\"alpha\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a5,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_490,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_490);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a6,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_490);
  ptVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>(ptVar4);
  boost::detail::test_impl
            ("where->same<double>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a7,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_4c8,3.0);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_4c8);
  boost::detail::test_impl
            ("*where == variable(3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6a8,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--(&local_4e0,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_1f8,&local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e0);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_518,3.0);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_518);
  boost::detail::test_impl
            ("*result == variable(3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6aa,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_530,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_530);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6ab,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_530);
  ptVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>(ptVar4);
  boost::detail::test_impl
            ("where->same<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6ac,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_568,2);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_568);
  boost::detail::test_impl
            ("*where == variable(2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6ad,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_568);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--(&local_580,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_1f8,&local_580);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_580);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_5b8,2);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_5b8);
  boost::detail::test_impl
            ("*result == variable(2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6af,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_5d0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6b0,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  ptVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<bool>(ptVar4);
  boost::detail::test_impl
            ("where->same<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6b1,"void post_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_608,true);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_608);
  boost::detail::test_impl
            ("*where == variable(true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x6b2,"void post_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    variable::iterator where = data.end();
    TRIAL_PROTOCOL_TEST(where == data.end());
    variable::iterator result = where--;
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::u32string_type>());
    TRIAL_PROTOCOL_TEST(*where == variable(U"delta"));
    result = where--;
    TRIAL_PROTOCOL_TEST(*result == variable(U"delta"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::u16string_type>());
    TRIAL_PROTOCOL_TEST(*where == variable(u"charlie"));
    result = where--;
    TRIAL_PROTOCOL_TEST(*result == variable(u"charlie"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::wstring_type>());
    TRIAL_PROTOCOL_TEST(*where == variable(L"bravo"));
    result = where--;
    TRIAL_PROTOCOL_TEST(*result == variable(L"bravo"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<variable::string_type>());
    TRIAL_PROTOCOL_TEST(*where == variable("alpha"));
    result = where--;
    TRIAL_PROTOCOL_TEST(*result == variable("alpha"));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<double>());
    TRIAL_PROTOCOL_TEST(*where == variable(3.0));
    result = where--;
    TRIAL_PROTOCOL_TEST(*result == variable(3.0));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<int>());
    TRIAL_PROTOCOL_TEST(*where == variable(2));
    result = where--;
    TRIAL_PROTOCOL_TEST(*result == variable(2));
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST(where->same<bool>());
    TRIAL_PROTOCOL_TEST(*where == variable(true));
}